

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O2

void Js::ProfilingHelpers::ProfiledStElem
               (Var base,Var varIndex,Var value,FunctionBody *functionBody,ProfileId profileId,
               PropertyOperationFlags flags,bool didArrayAccessHelperCall,
               bool bailedOutOnArraySpecialization)

{
  Type TVar1;
  Type TVar2;
  long lVar3;
  SparseArraySegmentBase *pSVar4;
  code *pcVar5;
  byte bVar6;
  bool bVar7;
  FldInfoFlags oldFlags;
  FldInfoFlags newFlags;
  uint uVar8;
  int iVar9;
  BOOL BVar10;
  undefined4 *puVar11;
  ScriptContext *scriptContext;
  JavascriptArray *pJVar12;
  INT_PTR IVar13;
  RecyclableObject *this;
  DynamicProfileInfo *pDVar14;
  FunctionBody *aValue;
  undefined6 in_register_00000082;
  undefined4 in_register_0000008c;
  uint uVar15;
  Var aValue_00;
  PropertyCacheOperationInfo local_8b;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_88;
  undefined1 auStack_86 [3];
  PropertyCacheOperationInfo operationInfo;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  RecyclableObject *object;
  JavascriptArray *local_70;
  ScriptContext *local_68;
  Var local_60;
  undefined4 local_54;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_50;
  undefined2 uStack_4e;
  undefined4 uStack_4c;
  RecyclableObject *cacheOwner;
  FunctionBody *pFStack_40;
  TypeId arrayTypeId;
  bool local_35;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  FldInfoFlags local_32;
  byte local_31;
  bool isObjectWithArray;
  StElemInfo stElemInfo;
  
  object = (RecyclableObject *)CONCAT44(in_register_0000008c,flags);
  pFStack_40 = (FunctionBody *)varIndex;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf1,"(base)","base");
    if (!bVar7) goto LAB_009da45d;
    *puVar11 = 0;
  }
  if (pFStack_40 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf2,"(varIndex)","varIndex");
    if (!bVar7) goto LAB_009da45d;
    *puVar11 = 0;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf3,"(value)","value");
    if (!bVar7) goto LAB_009da45d;
    *puVar11 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf4,"(functionBody)","functionBody");
    if (!bVar7) goto LAB_009da45d;
    *puVar11 = 0;
  }
  if (profileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf5,"(profileId != Constants::NoProfileId)",
                                "profileId != Constants::NoProfileId");
    if (!bVar7) goto LAB_009da45d;
    *puVar11 = 0;
  }
  StElemInfo::StElemInfo((StElemInfo *)&local_34.field_0);
  if (bailedOutOnArraySpecialization) {
    local_31 = local_31 | 0x40;
  }
  bVar7 = TaggedNumber::Is(base);
  if (bVar7) {
    bVar7 = false;
  }
  else {
    bVar7 = *base == VirtualTableInfo<Js::JavascriptArray>::Address;
  }
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  local_54 = (undefined4)CONCAT62(in_register_00000082,profileId);
  if (bVar7) {
    bVar7 = JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
    if (!bVar7) {
      pJVar12 = UnsafeVarTo<Js::JavascriptArray>(base);
      local_50.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromArray(Array,pJVar12,TypeIds_Array);
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_50.field_0);
      bVar7 = JavascriptArray::HasNoMissingValues(pJVar12);
      local_31 = local_31 & 0xfd | bVar7 * '\x02';
      ProfiledStElem_FastPath
                (pJVar12,pFStack_40,value,scriptContext,(PropertyOperationFlags)object,
                 (StElemInfo *)&local_34.field_0);
      bVar7 = JavascriptArray::HasNoMissingValues(pJVar12);
      local_31 = local_31 & 0xfd | ((local_31 & 2) >> 1 & ~bVar7) * '\x02';
      pDVar14 = FunctionBody::GetDynamicProfileInfo(functionBody);
      goto LAB_009da420;
    }
    local_68 = scriptContext;
    local_60 = value;
    pJVar12 = UnsafeVarTo<Js::JavascriptArray>(base);
    local_35 = false;
    cacheOwner._4_4_ = TypeIds_Array;
  }
  else {
    local_68 = scriptContext;
    local_60 = value;
    pJVar12 = JavascriptArray::GetArrayForArrayOrObjectWithArray
                        (base,&local_35,(TypeId *)((long)&cacheOwner + 4));
  }
  aValue = pFStack_40;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(base);
  local_70 = pJVar12;
  if (pJVar12 == (JavascriptArray *)0x0) {
    bVar7 = TypedArrayBase::TryGetLengthForOptimizedTypedArray
                      (base,(uint32 *)&local_50.bits,(TypeId *)((long)&cacheOwner + 4));
    aValue_00 = local_60;
    bVar6 = local_31;
    if (bVar7) {
      uVar15 = CONCAT22(uStack_4e,local_50.bits);
      lVar3 = *base;
      IVar13 = ValueType::GetVirtualTypedArrayVtable(cacheOwner._4_4_);
      aStack_88.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(cacheOwner._4_4_,lVar3 == IVar13);
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&aStack_88.field_0);
      bVar7 = TaggedNumber::Is(aValue_00);
      aValue = pFStack_40;
      if (aValue_00 < (Var)0x4000000000000 && !bVar7) {
        local_31 = local_31 | 8;
      }
      goto LAB_009da0fb;
    }
  }
  else {
    if (local_35 == true) {
      local_50.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObjectArray(pJVar12);
    }
    else {
      local_50.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromArray(Array,pJVar12,cacheOwner._4_4_);
    }
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_50.field_0);
    bVar7 = JavascriptArray::HasNoMissingValues(pJVar12);
    local_31 = local_31 & 0xfd | bVar7 * '\x02';
    uVar15 = (pJVar12->super_ArrayObject).length;
    pSVar4 = (pJVar12->head).ptr;
    if (pSVar4->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x134,"(head->left == 0)","head->left == 0");
      if (!bVar7) goto LAB_009da45d;
      *puVar11 = 0;
      aValue = pFStack_40;
    }
    TVar1 = pSVar4->length;
    local_50.bits = (Type)TVar1;
    uStack_4e = (undefined2)(TVar1 >> 0x10);
    aValue_00 = local_60;
LAB_009da0fb:
    if (didArrayAccessHelperCall) {
      local_31 = local_31 | 8;
    }
    bVar7 = TaggedInt::Is(aValue);
    if ((bVar7) && (uVar8 = TaggedInt::ToInt32(aValue), -1 < (int)uVar8)) {
      if (uVar8 < CONCAT22(uStack_4e,local_50.bits)) {
        bVar6 = local_31;
        if ((local_70 != (JavascriptArray *)0x0) &&
           (iVar9 = (*(local_70->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x77])(local_70,(ulong)uVar8), bVar6 = local_31,
           (char)iVar9 != '\0')) {
          bVar6 = local_31 | 4;
        }
      }
      else {
        bVar6 = local_31 | 0x10;
        if ((local_35 == false) && (uVar15 <= uVar8)) {
          bVar6 = local_31 | 0x30;
        }
      }
    }
    else {
      bVar6 = local_31 | 8;
    }
  }
  local_31 = bVar6;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar7) goto LAB_009da45d;
    *puVar11 = 0;
    aValue = pFStack_40;
  }
  bVar7 = TaggedInt::Is(base);
  if ((Var)0x3ffffffffffff < base || bVar7) {
LAB_009da2af:
    bVar7 = JavascriptOperators::GetPropertyRecordUsageCache
                      (aValue,local_68,(PropertyRecordUsageCache **)&aStack_88,
                       (RecyclableObject **)&local_50);
    if (!bVar7) goto LAB_009da39b;
    propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
    pFStack_40 = functionBody;
    bVar7 = JavascriptOperators::GetPropertyObjectForSetElementI
                      (base,(Var)CONCAT44(uStack_4c,CONCAT22(uStack_4e,local_50.bits)),local_68,
                       (RecyclableObject **)&propertyRecordUsageCache);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x172,"(result)","result");
      if (!bVar7) {
LAB_009da45d:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
    }
    local_8b.cacheType = CacheType_None;
    local_8b.slotType = SlotType_None;
    local_8b.isPolymorphic = false;
    JavascriptOperators::SetElementIWithCache<true>
              (base,(RecyclableObject *)propertyRecordUsageCache,
               (RecyclableObject *)CONCAT44(uStack_4c,CONCAT22(uStack_4e,local_50.bits)),aValue_00,
               (PropertyRecordUsageCache *)CONCAT62(_auStack_86,aStack_88.bits),local_68,
               (PropertyOperationFlags)object,&local_8b);
    oldFlags = DynamicProfileInfo::FldInfoFlagsFromCacheType(local_8b.cacheType);
    local_32 = oldFlags;
    newFlags = DynamicProfileInfo::FldInfoFlagsFromSlotType(local_8b.slotType);
    local_32 = DynamicProfileInfo::MergeFldInfoFlags(oldFlags,newFlags);
    functionBody = pFStack_40;
  }
  else {
    this = UnsafeVarTo<Js::RecyclableObject>(base);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      local_60 = aValue_00;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar7) goto LAB_009da45d;
      *puVar11 = 0;
      aValue_00 = local_60;
    }
    TVar2 = ((this->type).ptr)->typeId;
    if (0x57 < (int)TVar2) {
      BVar10 = RecyclableObject::IsExternal(this);
      aValue = pFStack_40;
      if (BVar10 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar7) goto LAB_009da45d;
        *puVar11 = 0;
        aValue = pFStack_40;
      }
      goto LAB_009da2af;
    }
    aValue = pFStack_40;
    if (8 < TVar2 - TypeIds_Int8Array) goto LAB_009da2af;
LAB_009da39b:
    JavascriptOperators::OP_SetElementI
              (base,aValue,aValue_00,local_68,(PropertyOperationFlags)object);
  }
  propertyRecordUsageCache =
       (PropertyRecordUsageCache *)CONCAT62(propertyRecordUsageCache._2_6_,local_34.bits);
  bVar7 = ValueType::IsUninitialized((ValueType *)&propertyRecordUsageCache);
  if ((bVar7) && (local_32 == FldInfo_NoInfo)) {
    pDVar14 = FunctionBody::GetDynamicProfileInfo(functionBody);
    DynamicProfileInfo::RecordElementStoreAsProfiled(pDVar14,functionBody,(ProfileId)local_54);
    return;
  }
  if (local_70 != (JavascriptArray *)0x0) {
    bVar7 = JavascriptArray::HasNoMissingValues(local_70);
    local_31 = local_31 & 0xfd | ((local_31 & 2) >> 1 & ~bVar7) * '\x02';
  }
  pDVar14 = FunctionBody::GetDynamicProfileInfo(functionBody);
LAB_009da420:
  DynamicProfileInfo::RecordElementStore
            (pDVar14,functionBody,(ProfileId)local_54,(StElemInfo *)&local_34.field_0);
  return;
}

Assistant:

void ProfilingHelpers::ProfiledStElem(
        const Var base,
        const Var varIndex,
        const Var value,
        FunctionBody *const functionBody,
        const ProfileId profileId,
        const PropertyOperationFlags flags,
        bool didArrayAccessHelperCall,
        bool bailedOutOnArraySpecialization)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledStElem);
        Assert(base);
        Assert(varIndex);
        Assert(value);
        Assert(functionBody);
        Assert(profileId != Constants::NoProfileId);

        StElemInfo stElemInfo;

        if (bailedOutOnArraySpecialization)
        {
            stElemInfo.disableAggressiveSpecialization = true;
        }

        // Only enable fast path if the javascript array is not cross site
        const bool isJsArray = !TaggedNumber::Is(base) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(base);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        const bool fastPath = isJsArray && !JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
        if(fastPath)
        {
            JavascriptArray *const array = UnsafeVarTo<JavascriptArray>(base);
            stElemInfo.arrayType = ValueType::FromArray(ObjectType::Array, array, TypeIds_Array).ToLikely();
            stElemInfo.createdMissingValue = array->HasNoMissingValues();

            ProfiledStElem_FastPath(array, varIndex, value, scriptContext, flags, &stElemInfo);

            stElemInfo.createdMissingValue &= !array->HasNoMissingValues();
            functionBody->GetDynamicProfileInfo()->RecordElementStore(functionBody, profileId, stElemInfo);
            return;
        }

        JavascriptArray *array;
        bool isObjectWithArray;
        TypeId arrayTypeId;
        if(isJsArray)
        {
            array = UnsafeVarTo<JavascriptArray>(base);
            isObjectWithArray = false;
            arrayTypeId = TypeIds_Array;
        }
        else
        {
            array = JavascriptArray::GetArrayForArrayOrObjectWithArray(base, &isObjectWithArray, &arrayTypeId);
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(base);
#endif

        do // while(false)
        {
            // The fast path is only for JavascriptArray and doesn't cover native arrays, objects with internal arrays, or typed
            // arrays, but we still need to profile the array

            uint32 length;
            uint32 headSegmentLength;
            if(array)
            {
                stElemInfo.arrayType =
                    (
                        isObjectWithArray
                            ? ValueType::FromObjectArray(array)
                            : ValueType::FromArray(ObjectType::Array, array, arrayTypeId)
                    ).ToLikely();
                stElemInfo.createdMissingValue = array->HasNoMissingValues();

                length = array->GetLength();
                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                headSegmentLength = head->length;
            }
            else if(TypedArrayBase::TryGetLengthForOptimizedTypedArray(base, &headSegmentLength, &arrayTypeId))
            {
                length = headSegmentLength;
                bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(base) == ValueType::GetVirtualTypedArrayVtable(arrayTypeId));
                stElemInfo.arrayType = ValueType::FromTypeId(arrayTypeId, isVirtual).ToLikely();
                if (!TaggedNumber::Is(value) && !JavascriptNumber::Is_NoTaggedIntCheck(value))
                {
                    // Non-number stored to a typed array. A helper call will be needed to convert the value.
                    stElemInfo.neededHelperCall = true;
                }
            }
            else
            {
                break;
            }

            if (didArrayAccessHelperCall)
            {
                stElemInfo.neededHelperCall = true;
            }

            if(!TaggedInt::Is(varIndex))
            {
                stElemInfo.neededHelperCall = true;
                break;
            }

            const int32 index = TaggedInt::ToInt32(varIndex);
            if(index < 0)
            {
                stElemInfo.neededHelperCall = true;
                break;
            }

            const uint32 offset = index;
            if(offset >= headSegmentLength)
            {
                stElemInfo.storedOutsideHeadSegmentBounds = true;
                if(!isObjectWithArray && offset >= length)
                {
                    stElemInfo.storedOutsideArrayBounds = true;
                }
                break;
            }

            if(array && array->IsMissingHeadSegmentItem(offset))
            {
                stElemInfo.filledMissingValue = true;
            }
        } while(false);

        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        TypeId instanceType = JavascriptOperators::GetTypeId(base);
        bool isTypedArray = (instanceType >= TypeIds_Int8Array && instanceType <= TypeIds_Float64Array);
        if (!isTypedArray && JavascriptOperators::GetPropertyRecordUsageCache(varIndex, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            RecyclableObject* object = nullptr;
            bool result = JavascriptOperators::GetPropertyObjectForSetElementI(base, cacheOwner, scriptContext, &object);
            Assert(result);

            PropertyCacheOperationInfo operationInfo;
            JavascriptOperators::SetElementIWithCache<true /* ReturnOperationInfo */>(base, object, cacheOwner, value, propertyRecordUsageCache, scriptContext, flags, &operationInfo);

            stElemInfo.flags = DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType);
            stElemInfo.flags = DynamicProfileInfo::MergeFldInfoFlags(stElemInfo.flags, DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));
        }
        else
        {
            JavascriptOperators::OP_SetElementI(base, varIndex, value, scriptContext, flags);
        }

        if(!stElemInfo.GetArrayType().IsUninitialized() || stElemInfo.flags != Js::FldInfo_NoInfo)
        {
            if(array)
            {
                stElemInfo.createdMissingValue &= !array->HasNoMissingValues();
            }

            functionBody->GetDynamicProfileInfo()->RecordElementStore(functionBody, profileId, stElemInfo);
            return;
        }

        functionBody->GetDynamicProfileInfo()->RecordElementStoreAsProfiled(functionBody, profileId);
        JIT_HELPER_END(ProfiledStElem);
    }